

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBaseClass.cpp
# Opt level: O0

void __thiscall vkt::Draw::DrawTestsBaseClass::initialize(DrawTestsBaseClass *this)

{
  undefined1 *this_00;
  VkFormat _format;
  DeviceInterface *pDVar1;
  RefData<vk::Handle<(vk::HandleType)16>_> data;
  RefData<vk::Handle<(vk::HandleType)13>_> data_00;
  RefData<vk::Handle<(vk::HandleType)17>_> data_01;
  RefData<vk::Handle<(vk::HandleType)23>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  VkAttachmentDescription attachment;
  VkSubpassDescription subpass;
  VkExtent3D _extent;
  VkDevice device_00;
  Allocator *pAVar2;
  Image *this_01;
  Handle<(vk::HandleType)13> *pHVar3;
  reference pvVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  size_type sVar6;
  Buffer *pBVar7;
  void *dst;
  reference src;
  VkDeviceSize offset;
  Handle<(vk::HandleType)24> *pHVar8;
  Move<vk::VkCommandBuffer_s_*> local_760;
  RefData<vk::VkCommandBuffer_s_*> local_740;
  Move<vk::Handle<(vk::HandleType)24>_> local_720;
  RefData<vk::Handle<(vk::HandleType)24>_> local_700;
  undefined1 local_6e0 [8];
  CmdPoolCreateInfo cmdPoolCreateInfo;
  Allocation local_6a8;
  VkDeviceMemory local_688;
  Allocation local_680;
  void *local_660;
  deUint8 *ptr;
  BufferCreateInfo local_650;
  undefined1 local_600 [24];
  VkDeviceSize dataSize;
  VkDevice pVStack_5e0;
  VkAllocationCallbacks *local_5d8;
  VkVertexInputBindingDescription *pVStack_5d0;
  VkDevice local_5c8;
  VkVertexInputAttributeDescription *pVStack_5c0;
  undefined1 auStack_5b8 [8];
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [3];
  undefined1 local_580 [8];
  VkVertexInputBindingDescription vertexInputBindingDescription;
  RefData<vk::Handle<(vk::HandleType)23>_> local_550;
  deUint64 local_530;
  undefined1 local_528 [8];
  FramebufferCreateInfo framebufferCreateInfo;
  undefined1 local_4e0 [8];
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  colorAttachments;
  RefData<vk::Handle<(vk::HandleType)17>_> local_4a8;
  VkAttachmentReference local_488;
  VkAttachmentReference local_480;
  SubpassDescription local_478;
  VkSubpassDescription local_3c8;
  VkAttachmentReference local_378;
  VkAttachmentReference colorAttachmentReference;
  undefined4 uStack_368;
  undefined8 uStack_364;
  undefined8 local_35c;
  undefined8 uStack_354;
  VkImageLayout local_34c;
  undefined1 local_318 [8];
  RenderPassCreateInfo renderPassCreateInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_228;
  VkComponentMapping local_208;
  VkImage local_1f8;
  undefined1 local_1f0 [8];
  ImageViewCreateInfo colorTargetViewInfo;
  undefined1 local_198 [48];
  undefined1 local_168 [8];
  ImageCreateInfo targetImageCreateInfo;
  VkExtent3D targetImageExtent;
  RefData<vk::Handle<(vk::HandleType)16>_> local_c8;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_98;
  undefined1 local_80 [8];
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  deUint32 queueFamilyIndex;
  VkDevice device;
  DrawTestsBaseClass *this_local;
  
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  pipelineLayoutCreateInfo.m_pushConstantRanges.
  super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_98.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&local_98);
  PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)local_80,&local_98,0,(VkPushConstantRange *)0x0);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~vector(&local_98);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&targetImageExtent.depth,this->m_vk,device_00,
             (VkPipelineLayoutCreateInfo *)local_80,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&targetImageExtent.depth);
  data.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
  data.object.m_internal = local_c8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=(&this->m_pipelineLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&targetImageExtent.depth);
  targetImageCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x10000000100;
  targetImageExtent.width = 1;
  local_198._40_4_ = 1;
  local_198._32_8_ = (VkDevice)0x10000000100;
  local_198._24_4_ = 1;
  local_198._16_8_ = 0x10000000100;
  _extent.depth = 1;
  _extent.width = 0x100;
  _extent.height = 0x100;
  ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_168,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1
             ,VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar1 = this->m_vk;
  pAVar2 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  colorTargetViewInfo.super_VkImageViewCreateInfo._76_4_ = ::vk::MemoryRequirement::Any.m_flags;
  Draw::Image::createAndAlloc
            ((Image *)local_198,pDVar1,device_00,(VkImageCreateInfo *)local_168,pAVar2,
             ::vk::MemoryRequirement::Any);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorTargetImage,(SharedPtr<vkt::Draw::Image> *)local_198);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_198);
  this_01 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  local_1f8 = Draw::Image::object(this_01);
  _format = this->m_colorAttachmentFormat;
  ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_208,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  ImageViewCreateInfo::ImageViewCreateInfo
            ((ImageViewCreateInfo *)local_1f0,local_1f8,VK_IMAGE_VIEW_TYPE_2D,_format,&local_208,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &renderPassCreateInfo.m_dependiencesStructs.
              super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this->m_vk,device_00,
             (VkImageViewCreateInfo *)local_1f0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_228,
             (Move *)&renderPassCreateInfo.m_dependiencesStructs.
                      super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_228.deleter.m_deviceIface;
  data_00.object.m_internal = local_228.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_228.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_228.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_228.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_228.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_228.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_colorTargetView,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &renderPassCreateInfo.m_dependiencesStructs.
              super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)local_318,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&colorAttachmentReference.layout,this->m_colorAttachmentFormat
             ,VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)uStack_364;
  attachment.flags = colorAttachmentReference.layout;
  attachment.format = uStack_368;
  attachment.loadOp = (int)((ulong)uStack_364 >> 0x20);
  attachment.storeOp = (int)local_35c;
  attachment.stencilLoadOp = (int)((ulong)local_35c >> 0x20);
  attachment.stencilStoreOp = (int)uStack_354;
  attachment.initialLayout = (int)((ulong)uStack_354 >> 0x20);
  attachment.finalLayout = local_34c;
  RenderPassCreateInfo::addAttachment((RenderPassCreateInfo *)local_318,attachment);
  local_378.attachment = 0;
  local_378.layout = VK_IMAGE_LAYOUT_GENERAL;
  AttachmentReference::AttachmentReference((AttachmentReference *)&local_488);
  local_480 = local_488;
  SubpassDescription::SubpassDescription
            (&local_478,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,(VkAttachmentReference *)0x0,1,
             &local_378,(VkAttachmentReference *)0x0,local_488,0,(deUint32 *)0x0);
  local_3c8.pPreserveAttachments = local_478.super_VkSubpassDescription.pPreserveAttachments;
  local_3c8.pDepthStencilAttachment = local_478.super_VkSubpassDescription.pDepthStencilAttachment;
  local_3c8.preserveAttachmentCount = local_478.super_VkSubpassDescription.preserveAttachmentCount;
  local_3c8._60_4_ = local_478.super_VkSubpassDescription._60_4_;
  local_3c8.pColorAttachments = local_478.super_VkSubpassDescription.pColorAttachments;
  local_3c8.pResolveAttachments = local_478.super_VkSubpassDescription.pResolveAttachments;
  local_3c8.pInputAttachments = local_478.super_VkSubpassDescription.pInputAttachments;
  local_3c8.colorAttachmentCount = local_478.super_VkSubpassDescription.colorAttachmentCount;
  local_3c8._28_4_ = local_478.super_VkSubpassDescription._28_4_;
  local_3c8.flags = local_478.super_VkSubpassDescription.flags;
  local_3c8.pipelineBindPoint = local_478.super_VkSubpassDescription.pipelineBindPoint;
  local_3c8.inputAttachmentCount = local_478.super_VkSubpassDescription.inputAttachmentCount;
  local_3c8._12_4_ = local_478.super_VkSubpassDescription._12_4_;
  subpass.inputAttachmentCount = local_478.super_VkSubpassDescription.inputAttachmentCount;
  subpass.flags = local_478.super_VkSubpassDescription.flags;
  subpass.pipelineBindPoint = local_478.super_VkSubpassDescription.pipelineBindPoint;
  subpass._12_4_ = local_478.super_VkSubpassDescription._12_4_;
  subpass.pInputAttachments._0_4_ = (int)local_478.super_VkSubpassDescription.pInputAttachments;
  subpass.pInputAttachments._4_4_ =
       (int)((ulong)local_478.super_VkSubpassDescription.pInputAttachments >> 0x20);
  subpass.colorAttachmentCount = local_478.super_VkSubpassDescription.colorAttachmentCount;
  subpass._28_4_ = local_478.super_VkSubpassDescription._28_4_;
  subpass.pColorAttachments._0_4_ = (int)local_478.super_VkSubpassDescription.pColorAttachments;
  subpass.pColorAttachments._4_4_ =
       (int)((ulong)local_478.super_VkSubpassDescription.pColorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = (int)local_478.super_VkSubpassDescription.pResolveAttachments;
  subpass.pResolveAttachments._4_4_ =
       (int)((ulong)local_478.super_VkSubpassDescription.pResolveAttachments >> 0x20);
  subpass.pDepthStencilAttachment = local_478.super_VkSubpassDescription.pDepthStencilAttachment;
  subpass.preserveAttachmentCount = local_478.super_VkSubpassDescription.preserveAttachmentCount;
  subpass._60_4_ = local_478.super_VkSubpassDescription._60_4_;
  subpass.pPreserveAttachments._0_4_ =
       (int)local_478.super_VkSubpassDescription.pPreserveAttachments;
  subpass.pPreserveAttachments._4_4_ =
       (int)((ulong)local_478.super_VkSubpassDescription.pPreserveAttachments >> 0x20);
  RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)local_318,subpass);
  SubpassDescription::~SubpassDescription(&local_478);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &colorAttachments.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_vk,device_00,
             (VkRenderPassCreateInfo *)local_318,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4a8,
             (Move *)&colorAttachments.
                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_4a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_4a8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4a8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_4a8.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_4a8.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_4a8.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_4a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &colorAttachments.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &framebufferCreateInfo.super_VkFramebufferCreateInfo.field_0x3f;
  std::allocator<vk::Handle<(vk::HandleType)13>_>::allocator
            ((allocator<vk::Handle<(vk::HandleType)13>_> *)this_00);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )local_4e0,1,(allocator_type *)this_00);
  std::allocator<vk::Handle<(vk::HandleType)13>_>::~allocator
            ((allocator<vk::Handle<(vk::HandleType)13>_> *)
             &framebufferCreateInfo.super_VkFramebufferCreateInfo.field_0x3f);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                     (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  pvVar4 = std::
           vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                         *)local_4e0,0);
  pvVar4->m_internal = pHVar3->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_530 = pHVar5->m_internal;
  FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)local_528,(VkRenderPass)local_530,
             (vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              *)local_4e0,0x100,0x100,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexInputBindingDescription.inputRate,
             this->m_vk,device_00,(VkFramebufferCreateInfo *)local_528,(VkAllocationCallbacks *)0x0)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_550,(Move *)&vertexInputBindingDescription.inputRate);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_550.deleter.m_deviceIface;
  data_02.object.m_internal = local_550.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_550.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_550.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_550.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_550.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_550.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexInputBindingDescription.inputRate);
  local_580._0_4_ = 0;
  local_580._4_4_ = 0x24;
  vertexInputBindingDescription.binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  vertexInputAttributeDescriptions[1].offset = 0;
  vertexInputAttributeDescriptions[2].location = 99;
  vertexInputAttributeDescriptions[2].binding = 0x20;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R4G4_UNORM_PACK8;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0x6d;
  vertexInputAttributeDescriptions[1].binding = 0x10;
  auStack_5b8._0_4_ = 0;
  auStack_5b8._4_4_ = 0;
  vertexInputAttributeDescriptions[0].location = 0x6d;
  vertexInputAttributeDescriptions[0].binding = 0;
  PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)&dataSize,1,(VkVertexInputBindingDescription *)local_580,3,
             (VkVertexInputAttributeDescription *)auStack_5b8);
  *(VkDevice *)
   &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
    vertexAttributeDescriptionCount = local_5c8;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = pVStack_5c0;
  *(VkAllocationCallbacks **)
   &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags = local_5d8;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       pVStack_5d0;
  *(VkDeviceSize *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo = dataSize
  ;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext = pVStack_5e0;
  sVar6 = std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
          size(&this->m_data);
  local_600._16_8_ = sVar6 * 0x24;
  pDVar1 = this->m_vk;
  BufferCreateInfo::BufferCreateInfo
            (&local_650,local_600._16_8_,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar2 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ptr._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_600,pDVar1,device_00,&local_650.super_VkBufferCreateInfo,pAVar2,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_vertexBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_600);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_600);
  BufferCreateInfo::~BufferCreateInfo(&local_650);
  pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_680,pBVar7);
  dst = ::vk::Allocation::getHostPtr(&local_680);
  ::vk::Allocation::~Allocation(&local_680);
  local_660 = dst;
  src = std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
        operator[](&this->m_data,0);
  ::deMemcpy(dst,src,local_600._16_8_);
  pDVar1 = this->m_vk;
  pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_6a8,pBVar7);
  local_688 = ::vk::Allocation::getMemory(&local_6a8);
  pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory
            ((Allocation *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags,pBVar7);
  offset = ::vk::Allocation::getOffset
                     ((Allocation *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags);
  ::vk::flushMappedMemoryRange(pDVar1,device_00,local_688,offset,local_600._16_8_);
  ::vk::Allocation::~Allocation
            ((Allocation *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags);
  ::vk::Allocation::~Allocation(&local_6a8);
  CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)local_6e0,
             pipelineLayoutCreateInfo.m_pushConstantRanges.
             super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,2);
  ::vk::createCommandPool
            (&local_720,this->m_vk,device_00,(VkCommandPoolCreateInfo *)local_6e0,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_700,(Move *)&local_720);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_700.deleter.m_deviceIface;
  data_03.object.m_internal = local_700.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_700.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_700.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_700.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_700.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_700.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_cmdPool,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_720);
  pDVar1 = this->m_vk;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  ::vk::allocateCommandBuffer
            (&local_760,pDVar1,device_00,(VkCommandPool)pHVar8->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_740,(Move *)&local_760);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_740.deleter.m_deviceIface;
  data_04.object = local_740.object;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_740.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_740.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_740.deleter.m_device >> 0x20);
  data_04.deleter.m_pool.m_internal._0_4_ = (int)local_740.deleter.m_pool.m_internal;
  data_04.deleter.m_pool.m_internal._4_4_ = (int)(local_740.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_cmdBuffer,data_04);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_760);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,device_00);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)local_4e0);
  RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)local_318);
  ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_168);
  PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo((PipelineLayoutCreateInfo *)local_80);
  return;
}

Assistant:

void DrawTestsBaseClass::initialize (void)
{
	const vk::VkDevice device				= m_context.getDevice();
	const deUint32 queueFamilyIndex			= m_context.getUniversalQueueFamilyIndex();

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout						= vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

	const vk::VkExtent3D targetImageExtent	= { WIDTH, HEIGHT, 1 };
	const ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, targetImageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
		vk::VK_IMAGE_TILING_OPTIMAL, vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

	m_colorTargetImage						= Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

	const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
	m_colorTargetView						= vk::createImageView(m_vk, device, &colorTargetViewInfo);

	RenderPassCreateInfo renderPassCreateInfo;
	renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
															 vk::VK_SAMPLE_COUNT_1_BIT,
															 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_IMAGE_LAYOUT_GENERAL,
															 vk::VK_IMAGE_LAYOUT_GENERAL));


	const vk::VkAttachmentReference colorAttachmentReference =
	{
		0,
		vk::VK_IMAGE_LAYOUT_GENERAL
	};

	renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
													   0,
													   0,
													   DE_NULL,
													   1,
													   &colorAttachmentReference,
													   DE_NULL,
													   AttachmentReference(),
													   0,
													   DE_NULL));

	m_renderPass		= vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

	std::vector<vk::VkImageView> colorAttachments(1);
	colorAttachments[0] = *m_colorTargetView;

	const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, colorAttachments, WIDTH, HEIGHT, 1);

	m_framebuffer		= vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

	const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0,
		sizeof(VertexElementData),
		vk::VK_VERTEX_INPUT_RATE_VERTEX,
	};

	const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},	// VertexElementData::position
		{
			1u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			static_cast<deUint32>(sizeof(tcu::Vec4))
		},  // VertexElementData::color
		{
			2u,
			0u,
			vk::VK_FORMAT_R32_SINT,
			static_cast<deUint32>(sizeof(tcu::Vec4)) * 2
		}   // VertexElementData::refVertexIndex
	};

	m_vertexInputState = PipelineCreateInfo::VertexInputState(1,
															  &vertexInputBindingDescription,
															  DE_LENGTH_OF_ARRAY(vertexInputAttributeDescriptions),
															  vertexInputAttributeDescriptions);

	const vk::VkDeviceSize dataSize = m_data.size() * sizeof(VertexElementData);
	m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize,
		vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &m_data[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   device,
							   m_vertexBuffer->getBoundMemory().getMemory(),
							   m_vertexBuffer->getBoundMemory().getOffset(),
							   dataSize);

	const CmdPoolCreateInfo cmdPoolCreateInfo(queueFamilyIndex);
	m_cmdPool	= vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);
	m_cmdBuffer	= vk::allocateCommandBuffer(m_vk, device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	initPipeline(device);
}